

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void P_PlayerStartStomp(AActor *actor,bool mononly)

{
  double dVar1;
  player_t *ppVar2;
  double dVar3;
  bool bVar4;
  CheckResult cres;
  FPortalGroupArray grouplist;
  FMultiBlockThingsIterator mit;
  FName local_22c;
  DAngle local_228;
  CheckResult local_220;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  local_1f8.data.Array = (unsigned_short *)0x0;
  local_1f8.data.Most = 0;
  local_1f8.data.Count = 0;
  local_1f8.method = 1;
  local_1f8.varused = '\0';
  local_1f8.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator(&local_1d0,&local_1f8,actor,-1.0,false);
LAB_0050c1f5:
  do {
    do {
      bVar4 = FMultiBlockThingsIterator::Next(&local_1d0,&local_220);
      if (!bVar4) {
        TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                  (&local_1d0.blockIterator.DynHash);
        TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
        return;
      }
    } while ((((local_220.thing == actor) || ((((local_220.thing)->flags).Value & 4) == 0)) ||
             ((ppVar2 = (local_220.thing)->player, ppVar2 != (player_t *)0x0 &&
              (ppVar2 == actor->player)))) ||
            ((dVar3 = (local_220.thing)->radius + actor->radius,
             dVar3 <= ABS(((local_220.thing)->__Pos).X - local_220.Position.X) ||
             (dVar3 <= ABS(((local_220.thing)->__Pos).Y - local_220.Position.Y)))));
    bVar4 = ppVar2 == (player_t *)0x0;
    if (bVar4) goto LAB_0050c288;
  } while (!bVar4 && mononly);
  goto LAB_0050c2a3;
LAB_0050c288:
  if ((bVar4 || !mononly) && ((((local_220.thing)->flags3).Value & 0x2000) != 0)) {
LAB_0050c2a3:
    dVar3 = (actor->__Pos).Z;
    dVar1 = ((local_220.thing)->__Pos).Z;
    if ((dVar3 <= (local_220.thing)->Height + dVar1) && (dVar1 <= dVar3 + actor->Height)) {
      local_22c.Index = 0xbc;
      local_228.Degrees = 0.0;
      P_DamageMobj(local_220.thing,actor,actor,1000000,&local_22c,0,&local_228);
    }
  }
  goto LAB_0050c1f5;
}

Assistant:

void P_PlayerStartStomp(AActor *actor, bool mononly)
{
	FPortalGroupArray grouplist;
	FMultiBlockThingsIterator mit(grouplist, actor);
	FMultiBlockThingsIterator::CheckResult cres;

	while ((mit.Next(&cres)))
	{
		AActor *th = cres.thing;

		if (!(th->flags & MF_SHOOTABLE))
			continue;

		// don't clip against self, and don't kill your own voodoo dolls
		if (th == actor || (th->player == actor->player && th->player != NULL))
			continue;

		double blockdist = th->radius + actor->radius;
		if (fabs(th->X() - cres.Position.X) >= blockdist || fabs(th->Y() - cres.Position.Y) >= blockdist)
			continue;

		// only kill monsters and other players
		if (th->player == NULL && !(th->flags3 & MF3_ISMONSTER))
			continue;

		if (th->player != NULL && mononly)
			continue;

		if (actor->Z() > th->Top())
			continue;        // overhead
		if (actor->Top() < th->Z())
			continue;        // underneath

		P_DamageMobj(th, actor, actor, TELEFRAG_DAMAGE, NAME_Telefrag);
	}
}